

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode Curl_ossl_connect(connectdata *conn,int sockindex)

{
  CURLcode CVar1;
  _Bool local_1;
  
  CVar1 = ossl_connect_common(conn,sockindex,false,&local_1);
  return CVar1;
}

Assistant:

CURLcode Curl_ossl_connect(struct connectdata *conn, int sockindex)
{
  CURLcode result;
  bool done = FALSE;

  result = ossl_connect_common(conn, sockindex, FALSE, &done);
  if(result)
    return result;

  DEBUGASSERT(done);

  return CURLE_OK;
}